

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O3

void * dmrC_allocator_allocate(allocator *A,size_t extra)

{
  undefined8 *__s;
  void *pvVar1;
  allocation_blob *paVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 *__size;
  ulong uVar5;
  long lVar6;
  allocation_blob *paVar7;
  ulong uVar8;
  size_t sVar9;
  
  puVar3 = (undefined8 *)(extra + A->size_);
  __size = (undefined8 *)(ulong)A->chunking_;
  if (__size < puVar3) {
    __assert_fail("size <= A->chunking_",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/allocate.c"
                  ,0x4d,"void *dmrC_allocator_allocate(struct allocator *, size_t)");
  }
  __s = (undefined8 *)A->freelist_;
  if (__s != (undefined8 *)0x0) {
    A->freelist_ = (void *)*__s;
    pvVar1 = memset(__s,0,(size_t)puVar3);
    return pvVar1;
  }
  uVar8 = (ulong)A->alignment_;
  paVar7 = A->blobs_;
  A->allocations = A->allocations + 1;
  A->useful_bytes = A->useful_bytes + (long)puVar3;
  uVar4 = (long)puVar3 + (uVar8 - 1) & -uVar8;
  if ((paVar7 == (allocation_blob *)0x0) || (uVar5 = paVar7->left, uVar5 < uVar4)) {
    lVar6 = 1;
    puVar3 = __size;
    paVar2 = (allocation_blob *)calloc(1,(size_t)__size);
    if (paVar2 == (allocation_blob *)0x0) {
      dmrC_allocator_allocate_cold_1();
      pvVar1 = *(void **)(lVar6 + 0x20);
      *puVar3 = pvVar1;
      *(undefined8 **)(lVar6 + 0x20) = puVar3;
      return pvVar1;
    }
    A->total_bytes = A->total_bytes + (long)__size;
    paVar2->next = paVar7;
    A->blobs_ = paVar2;
    uVar8 = uVar8 + 0x17 & -uVar8;
    uVar5 = (long)__size - uVar8;
    paVar2->left = uVar5;
    sVar9 = uVar8 - 0x18;
    paVar2->offset = sVar9;
    paVar7 = paVar2;
  }
  else {
    sVar9 = paVar7->offset;
  }
  paVar7->offset = sVar9 + uVar4;
  paVar7->left = uVar5 - uVar4;
  return (void *)((long)&paVar7[1].next + sVar9);
}

Assistant:

void *dmrC_allocator_allocate(struct allocator *A, size_t extra) {
  size_t size = extra + A->size_;
  size_t alignment = A->alignment_;
  struct allocation_blob *blob = A->blobs_;
  void *retval;

  assert(size <= A->chunking_);
  /*
  * NOTE! The freelist only works with things that are
  *  (a) sufficiently aligned
  *  (b) use a constant size
  * Don't try to free allocators that don't follow
  * these rules.
  */
  if (A->freelist_) {
    void **p = (void **)A->freelist_;
    retval = p;
    A->freelist_ = *p;
    memset(retval, 0, size);
    return retval;
  }

  A->allocations++;
  A->useful_bytes += size;
  size = (size + alignment - 1) & ~(alignment - 1);
  if (!blob || blob->left < size) {
    size_t offset, chunking = A->chunking_;
    struct allocation_blob *newblob =
        (struct allocation_blob *)dmrC_blob_alloc(chunking);
    if (!newblob) {
      fprintf(stderr, "out of memory\n");
      abort();
    }
    A->total_bytes += chunking;
    newblob->next = blob;
    blob = newblob;
    A->blobs_ = newblob;
    offset = offsetof(struct allocation_blob, data);
    offset = (offset + alignment - 1) & ~(alignment - 1);
    blob->left = chunking - offset;
    blob->offset = offset - offsetof(struct allocation_blob, data);
  }
  retval = blob->data + blob->offset;
  blob->offset += size;
  blob->left -= size;
  return retval;
}